

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int libssh2_knownhost_writeline
              (LIBSSH2_KNOWNHOSTS *hosts,libssh2_knownhost *known,char *buffer,size_t buflen,
              size_t *outlen,int type)

{
  int iVar1;
  
  if (known->magic == 0xdeadcafe) {
    iVar1 = knownhost_writeline(hosts,(known_host *)known->node,buffer,buflen,outlen,type);
    return iVar1;
  }
  iVar1 = _libssh2_error(hosts->session,-0x22,"Invalid host information");
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,
                            struct libssh2_knownhost *known,
                            char *buffer, size_t buflen,
                            size_t *outlen, /* the amount of written data */
                            int type)
{
    struct known_host *node;

    if(known->magic != KNOWNHOST_MAGIC)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "Invalid host information");

    node = known->node;

    return knownhost_writeline(hosts, node, buffer, buflen, outlen, type);
}